

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall olc::Sprite::Sprite(Sprite *this,int32_t w,int32_t h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Pixel *pPVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  this->modeSample = NORMAL;
  this->pColData = (Pixel *)0x0;
  this->width = w;
  this->height = h;
  iVar7 = h * w;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar7) {
    uVar5 = (long)iVar7 * 4;
  }
  pPVar4 = (Pixel *)operator_new__(uVar5);
  auVar3 = _DAT_00189050;
  auVar2 = _DAT_00189040;
  auVar1 = _DAT_00189030;
  if (iVar7 == 0) {
    this->pColData = pPVar4;
  }
  else {
    uVar8 = (long)iVar7 + 0x3fffffffffffffff;
    uVar5 = uVar8 & 0x3fffffffffffffff;
    auVar9._8_4_ = (int)uVar5;
    auVar9._0_8_ = uVar5;
    auVar9._12_4_ = (int)(uVar5 >> 0x20);
    lVar6 = 0;
    auVar9 = auVar9 ^ _DAT_00189050;
    do {
      auVar11._8_4_ = (int)lVar6;
      auVar11._0_8_ = lVar6;
      auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar12 = (auVar11 | auVar2) ^ auVar3;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ || iVar10 < auVar12._4_4_
                  ) & 1)) {
        pPVar4[lVar6].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        pPVar4[lVar6 + 1].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
      }
      auVar11 = (auVar11 | auVar1) ^ auVar3;
      iVar13 = auVar11._4_4_;
      if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
        pPVar4[lVar6 + 2].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
        pPVar4[lVar6 + 3].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
      }
      lVar6 = lVar6 + 4;
    } while ((uVar5 - ((uint)uVar8 & 3)) + 4 != lVar6);
    this->pColData = pPVar4;
    if (0 < iVar7) {
      lVar6 = 0;
      do {
        this->pColData[lVar6].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
        lVar6 = lVar6 + 1;
      } while (lVar6 < (long)this->height * (long)this->width);
    }
  }
  return;
}

Assistant:

Sprite::Sprite(int32_t w, int32_t h)
	{
		if (pColData) delete[] pColData;
		width = w;		height = h;
		pColData = new Pixel[width * height];
		for (int32_t i = 0; i < width * height; i++)
			pColData[i] = Pixel();
	}